

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat R_y(double Angle)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *extraout_RDX;
  undefined8 *in_RDI;
  Mat MVar4;
  undefined4 local_28;
  undefined4 uStack_24;
  
  dVar1 = cos(Angle);
  dVar2 = sin(Angle);
  *in_RDI = 0x300000003;
  pdVar3 = (double *)operator_new__(0x48);
  in_RDI[1] = pdVar3;
  *pdVar3 = dVar1;
  pdVar3[1] = 0.0;
  local_28 = SUB84(dVar2,0);
  uStack_24 = (undefined4)((ulong)dVar2 >> 0x20);
  pdVar3[2] = -dVar2;
  *(undefined4 *)(pdVar3 + 3) = 0;
  *(undefined4 *)((long)pdVar3 + 0x1c) = 0;
  *(undefined4 *)(pdVar3 + 4) = 0;
  *(undefined4 *)((long)pdVar3 + 0x24) = 0x3ff00000;
  pdVar3[5] = 0.0;
  *(undefined4 *)(pdVar3 + 6) = local_28;
  *(undefined4 *)((long)pdVar3 + 0x34) = uStack_24;
  pdVar3[7] = 0.0;
  pdVar3[8] = dVar1;
  MVar4.v_ = extraout_RDX;
  MVar4._0_8_ = in_RDI;
  return MVar4;
}

Assistant:

Mat R_y(double Angle)
{
	const double C = cos(Angle);
	const double S = sin(Angle);
	Mat U(3,3);
	U.v_[0] =  +C;
	U.v_[1] = 0.0;
	U.v_[2] =  -S;
	U.v_[3] = 0.0;
	U.v_[4] = 1.0;
	U.v_[5] = 0.0;
	U.v_[6] =  +S;
	U.v_[7] = 0.0;
	U.v_[8] =  +C;
	return U;
}